

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedFP64Case1::Run(AdvancedFP64Case1 *this)

{
  bool bVar1;
  GLuint GVar2;
  GLint location;
  double local_a8;
  GLdouble data_2;
  undefined8 uStack_98;
  int i_2;
  GLdouble expected [4];
  double local_70;
  GLdouble data_1;
  double dStack_60;
  GLuint i_1;
  GLdouble data;
  GLuint i;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *glsl_cs;
  AdvancedFP64Case1 *this_local;
  
  local_20 = 
  "\nlayout(local_size_x = 4) in;\nlayout(std140, binding = 0) buffer ShaderStorageBlock {\n  double data;\n} g_shader_storage[4];\nlayout(std140, binding = 0) uniform UniformBlock {\n  double data;\n} g_uniform[2];\nuniform dvec2 g_uniform_def;\n\nvoid main() {\n  if (gl_GlobalInvocationID.x == 0) {\n    g_shader_storage[0].data = floor(g_uniform[0].data + 0.1LF);\n  } else if (gl_GlobalInvocationID.x == 1) {\n    g_shader_storage[1].data = ceil(g_uniform[1].data + 0.2LF);\n  } else if (gl_GlobalInvocationID.x == 2) {\n    g_shader_storage[2].data = min(g_uniform_def[0] + 0.1LF, 1.0LF);\n  } else if (gl_GlobalInvocationID.x == 3) {\n    g_shader_storage[3].data = max(g_uniform_def[0], g_uniform_def.y);\n  }\n}"
  ;
  glsl_cs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "\nlayout(local_size_x = 4) in;\nlayout(std140, binding = 0) buffer ShaderStorageBlock {\n  double data;\n} g_shader_storage[4];\nlayout(std140, binding = 0) uniform UniformBlock {\n  double data;\n} g_uniform[2];\nuniform dvec2 g_uniform_def;\n\nvoid main() {\n  if (gl_GlobalInvocationID.x == 0) {\n    g_shader_storage[0].data = floor(g_uniform[0].data + 0.1LF);\n  } else if (gl_GlobalInvocationID.x == 1) {\n    g_shader_storage[1].data = ceil(g_uniform[1].data + 0.2LF);\n  } else if (gl_GlobalInvocationID.x == 2) {\n    g_shader_storage[2].data = min(g_uniform_def[0] + 0.1LF, 1.0LF);\n  } else if (gl_GlobalInvocationID.x == 3) {\n    g_shader_storage[3].data = max(g_uniform_def[0], g_uniform_def.y);\n  }\n}"
             ,&local_41);
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_40);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,(bool *)0x0);
  if (bVar1) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,4,this->m_storage_buffer);
    for (data._0_4_ = 0; data._0_4_ < 4; data._0_4_ = data._0_4_ + 1) {
      dStack_60 = (double)(data._0_4_ + 1);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,data._0_4_,this->m_storage_buffer[data._0_4_]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,8,&stack0xffffffffffffffa0,0x88e4);
    }
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,2,this->m_uniform_buffer);
    for (data_1._4_4_ = 0; data_1._4_4_ < 2; data_1._4_4_ = data_1._4_4_ + 1) {
      local_70 = (double)(data_1._4_4_ + 1);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8a11,data_1._4_4_,this->m_uniform_buffer[data_1._4_4_]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8a11,8,&local_70,0x88e4);
    }
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    location = glu::CallLogWrapper::glGetUniformLocation
                         (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                           super_CallLogWrapper,this->m_program,"g_uniform_def");
    glu::CallLogWrapper::glUniform2d
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,location,1.0,2.0);
    glu::CallLogWrapper::glDispatchCompute
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x200);
    uStack_98 = 0x3ff0000000000000;
    expected[0] = 3.0;
    expected[1] = 1.0;
    expected[2] = 2.0;
    for (data_2._4_4_ = 0; (int)data_2._4_4_ < 4; data_2._4_4_ = data_2._4_4_ + 1) {
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,this->m_storage_buffer[(int)data_2._4_4_]);
      glu::CallLogWrapper::glGetBufferSubData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,8,&local_a8);
      if ((local_a8 != expected[(long)(int)data_2._4_4_ + -1]) ||
         (NAN(local_a8) || NAN(expected[(long)(int)data_2._4_4_ + -1]))) {
        anon_unknown_0::Output
                  ("Data at index %d is %f should be %f.\n",local_a8,
                   expected[(long)(int)data_2._4_4_ + -1],(ulong)data_2._4_4_);
        return (long)&DAT_ffffffffffffffff;
      }
    }
    this_local = (AdvancedFP64Case1 *)0x0;
  }
  else {
    this_local = (AdvancedFP64Case1 *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 4) in;" NL "layout(std140, binding = 0) buffer ShaderStorageBlock {" NL
			   "  double data;" NL "} g_shader_storage[4];" NL "layout(std140, binding = 0) uniform UniformBlock {" NL
			   "  double data;" NL "} g_uniform[2];" NL "uniform dvec2 g_uniform_def;" NL NL "void main() {" NL
			   "  if (gl_GlobalInvocationID.x == 0) {" NL
			   "    g_shader_storage[0].data = floor(g_uniform[0].data + 0.1LF);" // floor(1.1LF) == 1.0LF
			NL "  } else if (gl_GlobalInvocationID.x == 1) {" NL
			   "    g_shader_storage[1].data = ceil(g_uniform[1].data + 0.2LF);" // ceil(2.2LF) == 3.0LF
			NL "  } else if (gl_GlobalInvocationID.x == 2) {" NL
			   "    g_shader_storage[2].data = min(g_uniform_def[0] + 0.1LF, 1.0LF);" // min(1.1LF, 1.0LF) == 1.0LF
			NL "  } else if (gl_GlobalInvocationID.x == 3) {" NL
			   "    g_shader_storage[3].data = max(g_uniform_def[0], g_uniform_def.y);" // max(1.0LF, 2.0LF) == 2.0LF
			NL "  }" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(4, m_storage_buffer);
		for (GLuint i = 0; i < 4; ++i)
		{
			const GLdouble data = static_cast<GLdouble>(i + 1);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), &data, GL_STATIC_DRAW);
		}

		glGenBuffers(2, m_uniform_buffer);
		for (GLuint i = 0; i < 2; ++i)
		{
			const GLdouble data = static_cast<GLdouble>(i + 1);
			glBindBufferBase(GL_UNIFORM_BUFFER, i, m_uniform_buffer[i]);
			glBufferData(GL_UNIFORM_BUFFER, sizeof(data), &data, GL_STATIC_DRAW);
		}

		glUseProgram(m_program);
		glUniform2d(glGetUniformLocation(m_program, "g_uniform_def"), 1.0, 2.0);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* validate */
		{
			const GLdouble expected[4] = { 1.0, 3.0, 1.0, 2.0 };
			for (int i = 0; i < 4; ++i)
			{
				GLdouble data;
				glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[i]);
				glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), &data);
				if (data != expected[i])
				{
					Output("Data at index %d is %f should be %f.\n", i, data, expected[i]);
					return ERROR;
				}
			}
		}
		return NO_ERROR;
	}